

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::BucketCountHashEqual>,_testing::internal::Types<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  bool bVar1;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  char *__rhs;
  char *str;
  allocator<char> local_1a1;
  internal *local_1a0;
  char *local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_190;
  char *local_188;
  char *local_180 [4];
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  
  local_1a0 = (internal *)test_names;
  local_198 = case_name;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,prefix,&local_1a1);
  __rhs = "/";
  if (*prefix == '\0') {
    __rhs = "";
  }
  local_188 = prefix;
  std::operator+(&local_100,&local_120,__rhs);
  std::operator+(&local_e0,&local_100,local_198);
  std::operator+(&local_c0,&local_e0,"/");
  std::operator+(&local_a0,&local_c0,
                 (type_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + index);
  GetPrefixUntilComma_abi_cxx11_(&local_160,local_1a0,str);
  local_190 = type_names;
  StripTrailingSpaces(&local_140,&local_160);
  GetTypeName<phmap::parallel_flat_hash_map<std::__cxx11::string,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>,4ul,phmap::NullMutex>>
            ();
  CodeLocation::CodeLocation(&local_80,code_location);
  set_up_tc = SuiteApiResolver<phmap::priv::gtest_suite_ConstructorTest_::BucketCountHashEqual<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_phmap::NullMutex>_>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,code_location->line);
  tear_down_tc = SuiteApiResolver<phmap::priv::gtest_suite_ConstructorTest_::BucketCountHashEqual<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_phmap::NullMutex>_>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002e0b50;
  MakeAndRegisterTestInfo
            (&local_a0,local_140._M_dataplus._M_p,local_180[0],(char *)0x0,&local_80,
             &TypeIdHelper<phmap::priv::ConstructorTest<phmap::parallel_flat_hash_map<std::__cxx11::string,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>,4ul,phmap::NullMutex>>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  CodeLocation::CodeLocation(&local_58,code_location);
  bVar1 = TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::BucketCountHashEqual>,_testing::internal::Types<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>_>
          ::Register(local_188,&local_58,local_198,(char *)local_1a0,index + 1,local_190);
  std::__cxx11::string::~string((string *)&local_58);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }